

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O0

int secp256k1_rangeproof_verify_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ecmult_gen_context *ecmult_gen_ctx,
              uchar *blindout,uint64_t *value_out,uchar *message_out,size_t *outlen,uchar *nonce,
              uint64_t *min_value,uint64_t *max_value,secp256k1_ge *commit,uchar *proof,size_t plen,
              uchar *extra_commit,size_t extra_commit_len,secp256k1_ge *genp)

{
  uint64_t uVar1;
  int iVar2;
  undefined4 uVar3;
  ulong uVar4;
  long *in_RCX;
  uchar *in_RDX;
  long in_RSI;
  long in_stack_00000008;
  uint64_t *in_stack_00000010;
  uint64_t *in_stack_00000018;
  secp256k1_gej *in_stack_00000028;
  secp256k1_gej *in_stack_00000030;
  long in_stack_00000038;
  uint64_t vv;
  secp256k1_scalar blind;
  secp256k1_fe fe;
  secp256k1_scalar mvs;
  uchar *e0;
  uchar m [33];
  uchar signs [31];
  uint64_t scale;
  int offset_post_header;
  size_t npub;
  int overflow;
  size_t rings;
  size_t offset;
  int mantissa;
  int exp;
  size_t i;
  int ret;
  size_t rsizes [32];
  secp256k1_sha256 sha256_m;
  secp256k1_scalar evalues [128];
  secp256k1_scalar s [128];
  secp256k1_ge c;
  secp256k1_gej pubs [128];
  secp256k1_gej accj;
  secp256k1_gej *psVar5;
  secp256k1_gej *r;
  uchar *in_stack_ffffffffffff9c08;
  secp256k1_sha256 *in_stack_ffffffffffff9c10;
  secp256k1_ge *in_stack_ffffffffffff9c18;
  uchar *in_stack_ffffffffffff9c20;
  uchar *in_stack_ffffffffffff9c28;
  secp256k1_sha256 *in_stack_ffffffffffff9c30;
  long local_63c0;
  secp256k1_scalar local_63b8;
  secp256k1_fe *in_stack_ffffffffffff9c68;
  secp256k1_ge *in_stack_ffffffffffff9c70;
  secp256k1_scalar local_6370;
  uchar *local_6350;
  char local_6318 [8];
  secp256k1_ge *in_stack_ffffffffffff9cf0;
  secp256k1_ge *in_stack_ffffffffffff9cf8;
  uint64_t in_stack_ffffffffffff9d00;
  secp256k1_scalar *in_stack_ffffffffffff9d08;
  secp256k1_gej *in_stack_ffffffffffff9d10;
  undefined4 in_stack_ffffffffffff9d18;
  long lVar6;
  size_t *rsizes_00;
  int in_stack_ffffffffffff9d2c;
  secp256k1_gej *pubs_00;
  secp256k1_gej *local_62c8;
  uint local_62c0;
  int local_62bc;
  secp256k1_gej *local_62b8;
  int local_62ac;
  long local_62a8 [10];
  secp256k1_fe *in_stack_ffffffffffff9da8;
  secp256k1_ge *in_stack_ffffffffffff9db0;
  secp256k1_gej *in_stack_ffffffffffff9db8;
  secp256k1_gej *in_stack_ffffffffffff9dc0;
  uchar *in_stack_ffffffffffff9dc8;
  secp256k1_scalar *in_stack_ffffffffffff9dd0;
  secp256k1_ecmult_context *in_stack_ffffffffffff9dd8;
  size_t in_stack_ffffffffffff9df0;
  uchar *in_stack_ffffffffffff9df8;
  size_t in_stack_ffffffffffff9e00;
  secp256k1_sha256 local_61a0 [9];
  int in_stack_ffffffffffffa26c;
  secp256k1_scalar *in_stack_ffffffffffffa270;
  secp256k1_ge *in_stack_ffffffffffffa278;
  secp256k1_gej *in_stack_ffffffffffffa280;
  secp256k1_gej local_40d8 [3];
  secp256k1_scalar *in_stack_ffffffffffffc0b8;
  secp256k1_scalar *in_stack_ffffffffffffc0c0;
  size_t *in_stack_ffffffffffffc0c8;
  uchar *in_stack_ffffffffffffc0d0;
  uint64_t *in_stack_ffffffffffffc0d8;
  secp256k1_scalar *in_stack_ffffffffffffc0e0;
  size_t *in_stack_ffffffffffffc100;
  size_t in_stack_ffffffffffffc108;
  uchar *in_stack_ffffffffffffc110;
  secp256k1_ge *in_stack_ffffffffffffc118;
  uchar *in_stack_ffffffffffffc120;
  size_t in_stack_ffffffffffffc128;
  secp256k1_ge *in_stack_ffffffffffffc130;
  secp256k1_gej local_d8;
  long *local_48;
  uchar *local_40;
  long local_38;
  int local_24;
  
  local_62c8 = (secp256k1_gej *)0x0;
  psVar5 = in_stack_00000028;
  r = in_stack_00000030;
  local_48 = in_RCX;
  local_40 = in_RDX;
  local_38 = in_RSI;
  iVar2 = secp256k1_rangeproof_getheader_impl
                    ((size_t *)&local_62c8,&local_62bc,(int *)&local_62c0,
                     (uint64_t *)&stack0xffffffffffff9d10,in_stack_00000010,in_stack_00000018,
                     (uchar *)in_stack_00000028,(size_t)in_stack_00000030);
  if (iVar2 == 0) {
    local_24 = 0;
  }
  else {
    uVar3 = SUB84(local_62c8,0);
    pubs_00 = (secp256k1_gej *)0x1;
    local_62a8[0] = 1;
    lVar6 = 1;
    if (local_62c0 != 0) {
      pubs_00 = (secp256k1_gej *)(long)((int)local_62c0 >> 1);
      for (local_62b8 = (secp256k1_gej *)0x0; local_62b8 < pubs_00;
          local_62b8 = (secp256k1_gej *)((long)(local_62b8->x).n + 1)) {
        local_62a8[(long)local_62b8] = 4;
      }
      lVar6 = (long)(((int)local_62c0 >> 1) << 2);
      if ((local_62c0 & 1) != 0) {
        local_62a8[(long)pubs_00] = 2;
        lVar6 = local_62a8[(long)pubs_00] + lVar6;
        pubs_00 = (secp256k1_gej *)((long)(pubs_00->x).n + 1);
      }
    }
    if ((ulong)((long)in_stack_00000030 - (long)local_62c8) <
        ((long)(pubs_00->x).n + lVar6 + -1) * 0x20 + 0x20 +
        ((ulong)((long)(pubs_00->x).n + 6U) >> 3)) {
      local_24 = 0;
    }
    else {
      secp256k1_sha256_initialize(local_61a0);
      secp256k1_rangeproof_serialize_point(in_stack_ffffffffffff9c20,in_stack_ffffffffffff9c18);
      secp256k1_sha256_write(in_stack_ffffffffffff9c10,in_stack_ffffffffffff9c08,(size_t)r);
      secp256k1_rangeproof_serialize_point(in_stack_ffffffffffff9c20,in_stack_ffffffffffff9c18);
      secp256k1_sha256_write(in_stack_ffffffffffff9c10,in_stack_ffffffffffff9c08,(size_t)r);
      secp256k1_sha256_write(in_stack_ffffffffffff9c10,in_stack_ffffffffffff9c08,(size_t)r);
      for (local_62b8 = (secp256k1_gej *)0x0; local_62b8 < &pubs_00[-1].field_0x7f;
          local_62b8 = (secp256k1_gej *)((long)local_62b8 + 1)) {
        local_6318[(long)local_62b8] =
             ((uint)*(byte *)((long)(in_stack_00000028->x).n +
                             (long)(local_62c8->x).n + ((ulong)local_62b8 >> 3)) &
             1 << ((byte)local_62b8 & 7)) != 0;
      }
      local_62c8 = (secp256k1_gej *)
                   ((long)(local_62c8->x).n + ((ulong)((long)(pubs_00->x).n + 6U) >> 3));
      if ((((ulong)&pubs_00[-1].field_0x7f & 7) == 0) ||
         ((int)(uint)(byte)(&local_62c8[-1].field_0x7f)[(long)&in_stack_00000028->x] >>
          ((char)pubs_00 - 1U & 7) == 0)) {
        rsizes_00 = (size_t *)0x0;
        secp256k1_gej_set_infinity((secp256k1_gej *)0x10edd2);
        if (*in_stack_00000010 != 0) {
          secp256k1_scalar_set_u64(&local_6370,*in_stack_00000010);
          secp256k1_ecmult_const
                    (in_stack_ffffffffffffa280,in_stack_ffffffffffffa278,in_stack_ffffffffffffa270,
                     in_stack_ffffffffffffa26c);
          secp256k1_scalar_clear(&local_6370);
        }
        for (local_62b8 = (secp256k1_gej *)0x0; local_62b8 < &pubs_00[-1].field_0x7f;
            local_62b8 = (secp256k1_gej *)((long)local_62b8 + 1)) {
          iVar2 = secp256k1_fe_set_b32
                            ((secp256k1_fe *)&stack0xffffffffffff9c68,
                             (uchar *)((long)(in_stack_00000028->x).n + (long)(local_62c8->x).n));
          if ((iVar2 == 0) ||
             (iVar2 = secp256k1_ge_set_xquad(in_stack_ffffffffffff9c70,in_stack_ffffffffffff9c68),
             iVar2 == 0)) {
            return 0;
          }
          if (local_6318[(long)local_62b8] != '\0') {
            secp256k1_ge_neg((secp256k1_ge *)r,(secp256k1_ge *)psVar5);
          }
          secp256k1_sha256_write(in_stack_ffffffffffff9c10,in_stack_ffffffffffff9c08,(size_t)r);
          secp256k1_sha256_write(in_stack_ffffffffffff9c10,in_stack_ffffffffffff9c08,(size_t)r);
          secp256k1_gej_set_ge(r,(secp256k1_ge *)psVar5);
          secp256k1_gej_add_ge_var
                    (in_stack_ffffffffffff9dc0,in_stack_ffffffffffff9db8,in_stack_ffffffffffff9db0,
                     in_stack_ffffffffffff9da8);
          local_62c8 = (secp256k1_gej *)((local_62c8->x).n + 4);
          rsizes_00 = (size_t *)(local_62a8[(long)local_62b8] + (long)rsizes_00);
        }
        secp256k1_gej_neg(r,psVar5);
        secp256k1_gej_add_ge_var
                  (in_stack_ffffffffffff9dc0,in_stack_ffffffffffff9db8,in_stack_ffffffffffff9db0,
                   in_stack_ffffffffffff9da8);
        iVar2 = secp256k1_gej_is_infinity(local_40d8 + (long)rsizes_00);
        if (iVar2 == 0) {
          secp256k1_rangeproof_pub_expand
                    (pubs_00,in_stack_ffffffffffff9d2c,rsizes_00,
                     CONCAT44(uVar3,in_stack_ffffffffffff9d18),
                     (secp256k1_ge *)in_stack_ffffffffffff9d10);
          uVar4 = local_62a8[(long)&pubs_00[-1].field_0x7f] + (long)rsizes_00;
          local_6350 = (uchar *)((long)(in_stack_00000028->x).n + (long)(local_62c8->x).n);
          for (local_62b8 = (secp256k1_gej *)0x0;
              local_62c8 = (secp256k1_gej *)((local_62c8->x).n + 4), local_62b8 < uVar4;
              local_62b8 = (secp256k1_gej *)((long)local_62b8 + 1)) {
            secp256k1_scalar_set_b32
                      ((secp256k1_scalar *)in_stack_ffffffffffff9c10,in_stack_ffffffffffff9c08,
                       (int *)r);
            if (in_stack_ffffffffffff9d2c != 0) {
              return 0;
            }
            in_stack_ffffffffffff9d2c = 0;
          }
          if (local_62c8 == in_stack_00000030) {
            if (in_stack_00000038 != 0) {
              secp256k1_sha256_write(in_stack_ffffffffffff9c10,in_stack_ffffffffffff9c08,(size_t)r);
            }
            secp256k1_sha256_finalize(in_stack_ffffffffffff9c30,in_stack_ffffffffffff9c28);
            local_62ac = secp256k1_borromean_verify
                                   (in_stack_ffffffffffff9dd8,in_stack_ffffffffffff9dd0,
                                    in_stack_ffffffffffff9dc8,
                                    (secp256k1_scalar *)in_stack_ffffffffffff9dc0,
                                    in_stack_ffffffffffff9db8,(size_t *)in_stack_ffffffffffff9db0,
                                    in_stack_ffffffffffff9df0,in_stack_ffffffffffff9df8,
                                    in_stack_ffffffffffff9e00);
            if ((local_62ac != 0) && (in_stack_00000008 != 0)) {
              if (local_38 == 0) {
                return 0;
              }
              psVar5 = (secp256k1_gej *)local_62a8;
              iVar2 = secp256k1_rangeproof_rewind_inner
                                (in_stack_ffffffffffffc0e0,in_stack_ffffffffffffc0d8,
                                 in_stack_ffffffffffffc0d0,in_stack_ffffffffffffc0c8,
                                 in_stack_ffffffffffffc0c0,in_stack_ffffffffffffc0b8,
                                 in_stack_ffffffffffffc100,in_stack_ffffffffffffc108,
                                 in_stack_ffffffffffffc110,in_stack_ffffffffffffc118,
                                 in_stack_ffffffffffffc120,in_stack_ffffffffffffc128,
                                 in_stack_ffffffffffffc130);
              if (iVar2 == 0) {
                return 0;
              }
              uVar1 = *in_stack_00000010;
              secp256k1_pedersen_ecmult
                        (in_stack_ffffffffffff9d10,in_stack_ffffffffffff9d08,
                         in_stack_ffffffffffff9d00,in_stack_ffffffffffff9cf8,
                         in_stack_ffffffffffff9cf0);
              iVar2 = secp256k1_gej_is_infinity(&local_d8);
              if (iVar2 != 0) {
                return 0;
              }
              secp256k1_gej_neg(pubs_00,psVar5);
              secp256k1_gej_add_ge_var
                        (in_stack_ffffffffffff9dc0,in_stack_ffffffffffff9db8,
                         in_stack_ffffffffffff9db0,in_stack_ffffffffffff9da8);
              iVar2 = secp256k1_gej_is_infinity(&local_d8);
              if (iVar2 == 0) {
                return 0;
              }
              if (local_40 != (uchar *)0x0) {
                secp256k1_scalar_get_b32(local_40,&local_63b8);
              }
              if (local_48 != (long *)0x0) {
                *local_48 = local_63c0 * (long)in_stack_ffffffffffff9d10 + uVar1;
              }
            }
            local_24 = local_62ac;
          }
          else {
            local_24 = 0;
          }
        }
        else {
          local_24 = 0;
        }
      }
      else {
        local_24 = 0;
      }
    }
  }
  return local_24;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_verify_impl(const secp256k1_ecmult_context* ecmult_ctx,
 const secp256k1_ecmult_gen_context* ecmult_gen_ctx,
 unsigned char *blindout, uint64_t *value_out, unsigned char *message_out, size_t *outlen, const unsigned char *nonce,
 uint64_t *min_value, uint64_t *max_value, const secp256k1_ge *commit, const unsigned char *proof, size_t plen, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_ge* genp) {
    secp256k1_gej accj;
    secp256k1_gej pubs[128];
    secp256k1_ge c;
    secp256k1_scalar s[128];
    secp256k1_scalar evalues[128]; /* Challenges, only used during proof rewind. */
    secp256k1_sha256 sha256_m;
    size_t rsizes[32];
    int ret;
    size_t i;
    int exp;
    int mantissa;
    size_t offset;
    size_t rings;
    int overflow;
    size_t npub;
    int offset_post_header;
    uint64_t scale;
    unsigned char signs[31];
    unsigned char m[33];
    const unsigned char *e0;
    offset = 0;
    if (!secp256k1_rangeproof_getheader_impl(&offset, &exp, &mantissa, &scale, min_value, max_value, proof, plen)) {
        return 0;
    }
    offset_post_header = offset;
    rings = 1;
    rsizes[0] = 1;
    npub = 1;
    if (mantissa != 0) {
        rings = (mantissa >> 1);
        for (i = 0; i < rings; i++) {
            rsizes[i] = 4;
        }
        npub = (mantissa >> 1) << 2;
        if (mantissa & 1) {
            rsizes[rings] = 2;
            npub += rsizes[rings];
            rings++;
        }
    }
    VERIFY_CHECK(rings <= 32);
    if (plen - offset < 32 * (npub + rings - 1) + 32 + ((rings+6) >> 3)) {
        return 0;
    }
    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_rangeproof_serialize_point(m, commit);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_rangeproof_serialize_point(m, genp);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_sha256_write(&sha256_m, proof, offset);
    for(i = 0; i < rings - 1; i++) {
        signs[i] = (proof[offset + ( i>> 3)] & (1 << (i & 7))) != 0;
    }
    offset += (rings + 6) >> 3;
    if ((rings - 1) & 7) {
        /* Number of coded blinded points is not a multiple of 8, force extra sign bits to 0 to reject mutation. */
        if ((proof[offset - 1] >> ((rings - 1) & 7)) != 0) {
            return 0;
        }
    }
    npub = 0;
    secp256k1_gej_set_infinity(&accj);
    if (*min_value) {
        secp256k1_scalar mvs;
        secp256k1_scalar_set_u64(&mvs, *min_value);
        secp256k1_ecmult_const(&accj, genp, &mvs, 64);
        secp256k1_scalar_clear(&mvs);
    }
    for(i = 0; i < rings - 1; i++) {
        secp256k1_fe fe;
        if (!secp256k1_fe_set_b32(&fe, &proof[offset]) ||
            !secp256k1_ge_set_xquad(&c, &fe)) {
            return 0;
        }
        if (signs[i]) {
            secp256k1_ge_neg(&c, &c);
        }
        /* Not using secp256k1_rangeproof_serialize_point as we almost have it
         * serialized form already. */
        secp256k1_sha256_write(&sha256_m, &signs[i], 1);
        secp256k1_sha256_write(&sha256_m, &proof[offset], 32);
        secp256k1_gej_set_ge(&pubs[npub], &c);
        secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
        offset += 32;
        npub += rsizes[i];
    }
    secp256k1_gej_neg(&accj, &accj);
    secp256k1_gej_add_ge_var(&pubs[npub], &accj, commit, NULL);
    if (secp256k1_gej_is_infinity(&pubs[npub])) {
        return 0;
    }
    secp256k1_rangeproof_pub_expand(pubs, exp, rsizes, rings, genp);
    npub += rsizes[rings - 1];
    e0 = &proof[offset];
    offset += 32;
    for (i = 0; i < npub; i++) {
        secp256k1_scalar_set_b32(&s[i], &proof[offset], &overflow);
        if (overflow) {
            return 0;
        }
        offset += 32;
    }
    if (offset != plen) {
        /*Extra data found, reject.*/
        return 0;
    }
    if (extra_commit != NULL) {
        secp256k1_sha256_write(&sha256_m, extra_commit, extra_commit_len);
    }
    secp256k1_sha256_finalize(&sha256_m, m);
    ret = secp256k1_borromean_verify(ecmult_ctx, nonce ? evalues : NULL, e0, s, pubs, rsizes, rings, m, 32);
    if (ret && nonce) {
        /* Given the nonce, try rewinding the witness to recover its initial state. */
        secp256k1_scalar blind;
        uint64_t vv;
        if (!ecmult_gen_ctx) {
            return 0;
        }
        if (!secp256k1_rangeproof_rewind_inner(&blind, &vv, message_out, outlen, evalues, s, rsizes, rings, nonce, commit, proof, offset_post_header, genp)) {
            return 0;
        }
        /* Unwind apparently successful, see if the commitment can be reconstructed. */
        /* FIXME: should check vv is in the mantissa's range. */
        vv = (vv * scale) + *min_value;
        secp256k1_pedersen_ecmult(&accj, &blind, vv, genp, &secp256k1_ge_const_g);
        if (secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        secp256k1_gej_neg(&accj, &accj);
        secp256k1_gej_add_ge_var(&accj, &accj, commit, NULL);
        if (!secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        if (blindout) {
            secp256k1_scalar_get_b32(blindout, &blind);
        }
        if (value_out) {
            *value_out = vv;
        }
    }
    return ret;
}